

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftoa.h
# Opt level: O2

size_t floaxie::ftoa<float,char>(float v,char *buffer)

{
  undefined8 in_RAX;
  size_t sVar1;
  int K;
  int len;
  
  if (NAN(v)) {
    builtin_strncpy(buffer,"nan",4);
  }
  else {
    if (ABS(v) != INFINITY) {
      if ((v == 0.0) && (!NAN(v))) {
        buffer[0] = '0';
        buffer[1] = '\0';
        return 1;
      }
      *buffer = '-';
      _K = in_RAX;
      grisu2<_19,_16,float,char>(v,buffer + (v < 0.0),&len,&K);
      sVar1 = prettify<16ul,char>(buffer + (v < 0.0),len,K);
      return sVar1 + (v < 0.0);
    }
    if (v <= 0.0) {
      builtin_strncpy(buffer,"-inf",5);
      return 4;
    }
    builtin_strncpy(buffer,"inf",4);
  }
  return 3;
}

Assistant:

inline std::size_t ftoa(FloatType v, CharType* buffer) noexcept
	{
		if (std::isnan(v))
		{
			buffer[0] = 'n';
			buffer[1] = 'a';
			buffer[2] = 'n';
			buffer[3] = '\0';

			return 3;
		}
		else if (std::isinf(v))
		{
			if (v > 0)
			{
				buffer[0] = 'i';
				buffer[1] = 'n';
				buffer[2] = 'f';
				buffer[3] = '\0';

				return 3;
			}
			else
			{
				buffer[0] = '-';
				buffer[1] = 'i';
				buffer[2] = 'n';
				buffer[3] = 'f';
				buffer[4] = '\0';

				return 4;
			}
		}
		else if (v == 0)
		{
			buffer[0] = '0';
			buffer[1] = '\0';

			return 1;
		}
		else
		{
			*buffer = '-';
			buffer += v < 0;

			constexpr int alpha(grisu_parameters<FloatType>.alpha), gamma(grisu_parameters<FloatType>.gamma);
			constexpr unsigned int decimal_scientific_threshold(16);

			int len, K;

			grisu2<alpha, gamma>(v, buffer, &len, &K);
			return (v < 0) + prettify<decimal_scientific_threshold>(buffer, len, K);
		}
	}